

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strcspn(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  uint uVar2;
  sxi32 sVar3;
  char *pcVar4;
  char *pcVar5;
  jx9_value *pjVar6;
  ulong uVar7;
  uint uVar8;
  anon_union_8_3_18420de5_for_x aVar9;
  int iLen;
  int iMasklen;
  char *zString;
  SyString sToken;
  int local_50;
  uint local_4c;
  char *local_48;
  SyString local_40;
  
  if (1 < nArg) {
    pcVar4 = jx9_value_to_string(*apArg,&local_50);
    local_48 = pcVar4;
    pcVar5 = jx9_value_to_string(apArg[1],(int *)&local_4c);
    if (0 < (long)local_50) {
      if ((int)local_4c < 1) {
        pjVar6 = pCtx->pRet;
        jx9MemObjRelease(pjVar6);
        (pjVar6->x).iVal = (long)local_50;
        goto LAB_00132b82;
      }
      if (nArg != 2) {
        pjVar6 = apArg[2];
        jx9MemObjToInteger(pjVar6);
        uVar2 = (uint)(pjVar6->x).iVal;
        if ((int)uVar2 < 0) {
          uVar8 = local_50 + uVar2;
          if (uVar8 == 0 || SCARRY4(local_50,uVar2) != (int)uVar8 < 0) {
            pjVar6 = pCtx->pRet;
            jx9MemObjRelease(pjVar6);
            (pjVar6->x).rVal = 0.0;
            pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | 2;
          }
          else {
            local_48 = pcVar4 + uVar8;
            local_50 = -uVar2;
          }
          if ((int)uVar8 < 1) {
            return 0;
          }
        }
        else {
          if (local_50 - uVar2 == 0 || local_50 < (int)uVar2) goto LAB_00132b6f;
          local_48 = pcVar4 + (uVar2 & 0x7fffffff);
          local_50 = local_50 - uVar2;
        }
        if (3 < nArg) {
          pjVar6 = apArg[3];
          jx9MemObjToInteger(pjVar6);
          iVar1 = *(int *)&pjVar6->x;
          if ((0 < iVar1) && (iVar1 < local_50)) {
            local_50 = iVar1;
          }
        }
      }
      sVar3 = ExtractNonSpaceToken(&local_48,local_48 + local_50,&local_40);
      if (local_40.nByte == 0 || sVar3 != 0) {
        aVar9.rVal = 0.0;
      }
      else {
        pcVar4 = local_40.zString;
        if (0 < (int)local_40.nByte) {
          do {
            if (0 < (int)local_4c) {
              uVar7 = 0;
              do {
                if (*pcVar4 == pcVar5[uVar7]) goto LAB_00132c7f;
                uVar7 = uVar7 + 1;
              } while (local_4c != uVar7);
            }
            pcVar4 = pcVar4 + 1;
          } while (pcVar4 < local_40.zString + (int)local_40.nByte);
        }
LAB_00132c7f:
        aVar9 = (anon_union_8_3_18420de5_for_x)(long)((int)pcVar4 - (int)local_40.zString);
      }
      pjVar6 = pCtx->pRet;
      jx9MemObjRelease(pjVar6);
      pjVar6->x = aVar9;
      goto LAB_00132b82;
    }
  }
LAB_00132b6f:
  pjVar6 = pCtx->pRet;
  jx9MemObjRelease(pjVar6);
  (pjVar6->x).rVal = 0.0;
LAB_00132b82:
  pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_strcspn(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zMask, *zEnd;
	int iMasklen, iLen;
	SyString sToken;
	int iCount = 0;
	int rc;
	if( nArg < 2 ){
		/* Missing agruments, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &iLen);
	/* Extract the mask */
	zMask = jx9_value_to_string(apArg[1], &iMasklen);
	if( iLen < 1 ){
		/* Nothing to process, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( iMasklen < 1 ){
		/* No given mask, return the string length */
		jx9_result_int(pCtx, iLen);
		return JX9_OK;
	}
	if( nArg > 2 ){
		int nOfft;
		/* Extract the offset */
		nOfft = jx9_value_to_int(apArg[2]);
		if( nOfft < 0 ){
			const char *zBase = &zString[iLen + nOfft];
			if( zBase > zString ){
				iLen = (int)(&zString[iLen]-zBase);
				zString = zBase;	
			}else{
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}
		}else{
			if( nOfft >= iLen ){
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}else{
				/* Update offset */
				zString += nOfft;
				iLen -= nOfft;
			}
		}
		if( nArg > 3 ){
			int iUserlen;
			/* Extract the desired length */
			iUserlen = jx9_value_to_int(apArg[3]);
			if( iUserlen > 0 && iUserlen < iLen ){
				iLen = iUserlen;
			}
		}
	}
	/* Point to the end of the string */
	zEnd = &zString[iLen];
	/* Extract the first non-space token */
	rc = ExtractNonSpaceToken(&zString, zEnd, &sToken);
	if( rc == SXRET_OK && sToken.nByte > 0 ){
		/* Compare against the current mask */
		iCount = LongestStringMask2(sToken.zString, (int)sToken.nByte, zMask, iMasklen);
	}
	/* Longest match */
	jx9_result_int(pCtx, iCount);
	return JX9_OK;
}